

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_endian.h
# Opt level: O0

uint16_t archive_le16dec(void *pp)

{
  uint p0;
  uint p1;
  uchar *p;
  void *pp_local;
  
  return *pp;
}

Assistant:

static inline uint16_t
archive_le16dec(const void *pp)
{
	unsigned char const *p = (unsigned char const *)pp;

	/* Store into unsigned temporaries before left shifting, to avoid
	promotion to signed int and then left shifting into the sign bit,
	which is undefined behaviour. */
	unsigned int p1 = p[1];
	unsigned int p0 = p[0];

	return ((p1 << 8) | p0);
}